

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

ssh_key * ecdsa_new_priv_openssh(ssh_keyalg *alg,BinarySource *src)

{
  ec_curve *curve;
  undefined8 *puVar1;
  WeierstrassPoint *pWVar2;
  mp_int *pmVar3;
  ssh_key *key;
  
  curve = (ec_curve *)(**alg->extra)();
  if (curve->type == EC_WEIERSTRASS) {
    BinarySource_get_string(src->binarysource_);
    puVar1 = (undefined8 *)safemalloc(1,0x20,0);
    key = (ssh_key *)(puVar1 + 3);
    puVar1[3] = alg;
    *puVar1 = curve;
    puVar1[2] = 0;
    pWVar2 = BinarySource_get_wpoint(src->binarysource_,curve);
    puVar1[1] = pWVar2;
    if (pWVar2 == (WeierstrassPoint *)0x0) {
      ecdsa_freekey(key);
      key = (ssh_key *)0x0;
    }
    else {
      pmVar3 = BinarySource_get_mp_ssh2(src->binarysource_);
      puVar1[2] = pmVar3;
    }
    return key;
  }
  __assert_fail("curve->type == EC_WEIERSTRASS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x399,"ssh_key *ecdsa_new_priv_openssh(const ssh_keyalg *, BinarySource *)");
}

Assistant:

static ssh_key *ecdsa_new_priv_openssh(
    const ssh_keyalg *alg, BinarySource *src)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_WEIERSTRASS);

    get_string(src);

    struct ecdsa_key *ek = snew(struct ecdsa_key);
    ek->sshk.vt = alg;
    ek->curve = curve;
    ek->privateKey = NULL;

    ek->publicKey = get_wpoint(src, curve);
    if (!ek->publicKey) {
        ecdsa_freekey(&ek->sshk);
        return NULL;
    }

    ek->privateKey = get_mp_ssh2(src);

    return &ek->sshk;
}